

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

char * CVmObjBigNum::round_val(vm_val_t *new_val,char *ext,size_t digits,int always_create)

{
  bool bVar1;
  int iVar2;
  vm_obj_id_t obj;
  char *ext_00;
  size_t sVar3;
  int in_ECX;
  ulong in_RDX;
  char *in_RSI;
  vm_val_t *in_RDI;
  char *new_ext;
  int need_round;
  size_t in_stack_ffffffffffffffa8;
  ulong uVar4;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar5;
  char *in_stack_ffffffffffffffb8;
  char *ext_01;
  char *ext_02;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  bVar1 = true;
  iVar2 = get_type(in_RSI);
  if ((iVar2 != 0) || (iVar2 = get_round_dir(in_stack_ffffffffffffffb8,iVar5), iVar2 == 0)) {
    if (in_ECX == 0) {
      vm_val_t::set_nil(in_RDI);
      return in_RSI;
    }
    bVar1 = false;
  }
  obj = create((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
  vm_val_t::set_obj(in_RDI,obj);
  ext_00 = get_objid_ext(0);
  set_prec((char *)in_RDI,in_stack_ffffffffffffffa8);
  iVar5 = (int)(in_stack_ffffffffffffffa8 >> 0x20);
  ext_01 = ext_00;
  iVar2 = get_neg(in_RSI);
  set_neg(ext_01,iVar2);
  ext_02 = ext_00;
  get_exp((char *)0x309537);
  set_exp((char *)in_RDI,iVar5);
  iVar5 = (int)((ulong)in_RDI >> 0x20);
  iVar2 = get_type(in_RSI);
  set_type(ext_00,iVar2);
  if (bVar1) {
    memcpy(ext_00 + 5,in_RSI + 5,in_RDX + 1 >> 1);
    round_up_abs(ext_02,(int)((ulong)ext_01 >> 0x20));
  }
  else {
    uVar4 = in_RDX;
    sVar3 = get_prec((char *)0x30957d);
    if (sVar3 < uVar4) {
      copy_val(ext_02,ext_01,iVar5);
    }
    else {
      memcpy(ext_00 + 5,in_RSI + 5,in_RDX + 1 >> 1);
    }
  }
  return ext_00;
}

Assistant:

const char *CVmObjBigNum::round_val(VMG_ vm_val_t *new_val, const char *ext,
                                    size_t digits, int always_create)
{
    /* presume we need rounding */
    int need_round = TRUE;

    /* 
     *   if the value is already no longer than the requested precision,
     *   return the original value; similarly, if we don't have to do any
     *   rounding to truncate to the requested precision, do not change
     *   the original object; likewise, don't bother changing anything if
     *   it's not a number 
     */
    if (get_type(ext) != VMBN_T_NUM || !get_round_dir(ext, digits))
    {
        if (always_create)
        {
            /* 
             *   we must create a new object regardless, but it won't need
             *   rounding 
             */
            need_round = FALSE;
        }
        else
        {
            /* return the original value */
            new_val->set_nil();
            return ext;
        }
    }

    /* allocate a new object with the requested precision */
    new_val->set_obj(create(vmg_ FALSE, digits));
    char *new_ext = get_objid_ext(vmg_ new_val->val.obj);

    /* copy the sign, exponent, and type information */
    set_prec(new_ext, digits);
    set_neg(new_ext, get_neg(ext));
    set_exp(new_ext, get_exp(ext));
    set_type(new_ext, get_type(ext));

    /* 
     *   if we don't need rounding, just truncate the old mantissa and
     *   return the result 
     */
    if (!need_round)
    {
        /* if the new size is smaller, truncate it */
        if (digits <= get_prec(ext))
        {
            /* copy the mantissa up to the requested new size */
            memcpy(new_ext + VMBN_MANT, ext + VMBN_MANT, (digits + 1)/2);
        }
        else
        {
            /* it's growing - simply copy the old value */
            copy_val(new_ext, ext, FALSE);
        }

        /* return the new value */
        return new_ext;
    }
    
    /* copy the mantissa up to the requested new precision */
    memcpy(new_ext + VMBN_MANT, ext + VMBN_MANT, (digits + 1)/2);

    /* round it up */
    round_up_abs(new_ext, digits);

    /* return the new extension */
    return new_ext;
}